

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.h
# Opt level: O2

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::~InterfaceVariableScalarReplacement
          (InterfaceVariableScalarReplacement *this)

{
  ~InterfaceVariableScalarReplacement(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

InterfaceVariableScalarReplacement() {}